

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O1

void prsvgfr(prscxdef *ctx,toktldef *lcltab,uint *encfr)

{
  ushort uVar1;
  ushort uVar2;
  emtcxdef *ctx_00;
  uchar *puVar3;
  uint16_t tmp_1;
  
  if ((ctx->prscxflg & 2) != 0) {
    ctx_00 = ctx->prscxemt;
    emtres(ctx_00,1);
    uVar1 = ctx_00->emtcxofs;
    ctx_00->emtcxofs = uVar1 + 1;
    ctx_00->emtcxptr[uVar1] = 'O';
    uVar1 = ctx_00->emtcxofs;
    emtres(ctx_00,2);
    puVar3 = ctx_00->emtcxptr;
    uVar2 = ctx_00->emtcxofs;
    (puVar3 + uVar2)[0] = '\0';
    (puVar3 + uVar2)[1] = '\0';
    ctx_00->emtcxofs = ctx_00->emtcxofs + 2;
    emtres(ctx_00,2);
    *(short *)(ctx_00->emtcxptr + ctx_00->emtcxofs) = (short)*encfr;
    ctx_00->emtcxofs = ctx_00->emtcxofs + 2;
    toktleach(&lcltab->toktlsc,prsvgf0,ctx);
    *(ushort *)(ctx_00->emtcxptr + uVar1) = ctx->prscxemt->emtcxofs - uVar1;
    *encfr = (uint)uVar1;
  }
  return;
}

Assistant:

static void prsvgfr(prscxdef *ctx, toktldef *lcltab, uint *encfr)
{
    if (ctx->prscxflg & PRSCXFLCL)
    {
        emtcxdef *ec = ctx->prscxemt;
        uint      ofs;
        uint      diff;

        /* write the FRAME instruction and operand header */
        emtop(ec, OPCFRAME);
        ofs = ec->emtcxofs;          /* remember the location of the length */
        emtint2(ec, 0);           /* placeholder - we'll fill this in later */
        emtint2(ec, *encfr);                /* point to the enclosing frame */
        
        /* write out the symbols using the callback iterator */
        toktleach(&lcltab->toktlsc, prsvgf0, ctx);
        
        /* now write the length of the table back at the beginning */
        diff = ctx->prscxemt->emtcxofs - ofs;
        emtint2at(ec, diff, ofs);
        
        /* the new table is now the current frame */
        *encfr = ofs;
    }
}